

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qparallelanimationgroup.cpp
# Opt level: O3

void QParallelAnimationGroup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  QParallelAnimationGroupPrivate::_q_uncontrolledAnimationFinished
            ((QParallelAnimationGroupPrivate *)(_o->d_ptr).d);
  return;
}

Assistant:

void QParallelAnimationGroup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QParallelAnimationGroup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->d_func()->_q_uncontrolledAnimationFinished(); break;
        default: ;
        }
    }
    (void)_a;
}